

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int readdigits(RN *rn,int hex)

{
  ushort uVar1;
  int iVar2;
  ushort **ppuVar3;
  bool bVar4;
  int local_18;
  int count;
  int hex_local;
  RN *rn_local;
  
  local_18 = 0;
  while( true ) {
    if (hex == 0) {
      ppuVar3 = __ctype_b_loc();
      uVar1 = (*ppuVar3)[rn->c] & 0x800;
    }
    else {
      ppuVar3 = __ctype_b_loc();
      uVar1 = (*ppuVar3)[rn->c] & 0x1000;
    }
    bVar4 = false;
    if (uVar1 != 0) {
      iVar2 = nextc(rn);
      bVar4 = iVar2 != 0;
    }
    if (!bVar4) break;
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

static int readdigits (RN *rn, int hex) {
  int count = 0;
  while ((hex ? isxdigit(rn->c) : isdigit(rn->c)) && nextc(rn))
    count++;
  return count;
}